

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::ConcatNode::IsCharTrieArm(ConcatNode *this,Compiler *compiler,uint *accNumAlts)

{
  uint uVar1;
  ThreadContext *this_00;
  ConcatNode *local_30;
  ConcatNode *curr;
  uint *accNumAlts_local;
  Compiler *compiler_local;
  ConcatNode *this_local;
  
  this_00 = Js::ScriptContext::GetThreadContext(compiler->scriptContext);
  ThreadContext::ProbeStackNoDispose(this_00,0x6000,compiler->scriptContext,(PVOID)0x0);
  local_30 = this;
  while( true ) {
    if (local_30 == (ConcatNode *)0x0) {
      return true;
    }
    uVar1 = (*local_30->head->_vptr_Node[0x14])(local_30->head,compiler,accNumAlts);
    if ((uVar1 & 1) == 0) break;
    local_30 = local_30->tail;
  }
  return false;
}

Assistant:

bool ConcatNode::IsCharTrieArm(Compiler& compiler, uint& accNumAlts) const
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        for (const ConcatNode* curr = this; curr != 0; curr = curr->tail)
        {
            if (!curr->head->IsCharTrieArm(compiler, accNumAlts))
                return false;
        }
        return true;
    }